

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O3

Constant *
spvtools::opt::anon_unknown_0::FoldClamp1
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  uint32_t uVar1;
  FeatureManager *pFVar2;
  pointer ppCVar3;
  Constant *pCVar4;
  Constant *pCVar5;
  long lVar6;
  BinaryScalarFoldingRule local_98;
  BinaryScalarFoldingRule local_78;
  Constant *local_58;
  Constant *pCStack_50;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_48;
  
  if (inst->opcode_ != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x5ec,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar1 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar1 = (uint)inst->has_result_id_;
  }
  uVar1 = Instruction::GetSingleWordOperand(inst,uVar1);
  pFVar2 = (context->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar2 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(context);
    pFVar2 = (context->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  if (uVar1 == pFVar2->extinst_importid_GLSLstd450_) {
    ppCVar3 = (constants->
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 1;
    do {
      if (ppCVar3[lVar6] == (Constant *)0x0) {
        return (Constant *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_78.super__Function_base._M_functor._8_8_ = 0;
    local_78.super__Function_base._M_functor._M_unused._M_object = FoldMax;
    local_78._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_78.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    uVar1 = 0;
    if (inst->has_type_id_ == true) {
      uVar1 = Instruction::GetSingleWordOperand(inst,0);
      ppCVar3 = (constants->
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    local_58 = ppCVar3[1];
    pCStack_50 = ppCVar3[2];
    ppCVar3 = (pointer)operator_new(0x10);
    local_48.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar3 + 2;
    *ppCVar3 = local_58;
    ppCVar3[1] = pCStack_50;
    local_48.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppCVar3;
    local_48.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pCVar4 = FoldFPBinaryOp(&local_78,uVar1,&local_48,context);
    operator_delete(ppCVar3,0x10);
    if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.super__Function_base._M_manager)
                ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
    }
    pCVar5 = (Constant *)0x0;
    uVar1 = 0;
    if (pCVar4 != (Constant *)0x0) {
      local_98.super__Function_base._M_functor._8_8_ = 0;
      local_98.super__Function_base._M_functor._M_unused._M_object = FoldMin;
      local_98._M_invoker =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_invoke;
      local_98.super__Function_base._M_manager =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_manager;
      if (inst->has_type_id_ == true) {
        uVar1 = Instruction::GetSingleWordOperand(inst,0);
      }
      pCVar5 = (constants->
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               )._M_impl.super__Vector_impl_data._M_start[3];
      ppCVar3 = (pointer)operator_new(0x10);
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar3 + 2;
      *ppCVar3 = pCVar4;
      ppCVar3[1] = pCVar5;
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppCVar3;
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5 = FoldFPBinaryOp(&local_98,uVar1,&local_48,context);
      operator_delete(ppCVar3,0x10);
      if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_98.super__Function_base._M_manager)
                  ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
      }
    }
    return pCVar5;
  }
  __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x5ef,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

const analysis::Constant* FoldClamp1(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  // Make sure all Clamp operands are constants.
  for (uint32_t i = 1; i < 4; i++) {
    if (constants[i] == nullptr) {
      return nullptr;
    }
  }

  const analysis::Constant* temp = FoldFPBinaryOp(
      FoldMax, inst->type_id(), {constants[1], constants[2]}, context);
  if (temp == nullptr) {
    return nullptr;
  }
  return FoldFPBinaryOp(FoldMin, inst->type_id(), {temp, constants[3]},
                        context);
}